

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Lexer::ParseComment(Lexer *this)

{
  bool bVar1;
  bool bVar2;
  uint local_18;
  uint32_t dashCount;
  bool blockComment;
  Lexer *this_local;
  
  AdvanceCurrent(this);
  bVar1 = IsNextCharacter(this,'-');
  if (bVar1) {
    AdvanceCurrent(this);
    while ((bVar1 = IsEndOfText(this), ((bVar1 ^ 0xffU) & 1) != 0 && (*this->m_current == '-'))) {
      AdvanceCurrent(this);
    }
    while (bVar1 = IsEndOfText(this), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_18 = 0;
      while( true ) {
        bVar2 = IsEndOfText(this);
        bVar1 = false;
        if (!bVar2) {
          bVar1 = *this->m_current == '-';
        }
        if (!bVar1) break;
        local_18 = local_18 + 1;
        AdvanceCurrent(this);
      }
      if (2 < local_18) {
        return;
      }
      bVar1 = IsNewline(this,*this->m_current);
      if (bVar1) {
        ParseEndOfLine(this);
      }
      else {
        AdvanceCurrent(this);
      }
    }
    Error<>(this,"Mismatched block comments");
  }
  else {
    while (bVar1 = IsEndOfText(this), ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = IsNewline(this,*this->m_current);
      if (bVar1) {
        ParseEndOfLine(this);
        return;
      }
      AdvanceCurrent(this);
    }
  }
  return;
}

Assistant:

inline_t void Lexer::ParseComment()
	{
		AdvanceCurrent();
		bool blockComment = IsNextCharacter('-');

		// This is a block comment
		if (blockComment)
		{
			AdvanceCurrent();

			// Advance until the end of the line or until we stop seeing dashes
			while (!IsEndOfText())
			{
				if (*m_current != '-')
					break;
				AdvanceCurrent();
			}

			// Find minimum run of three dashes to closed block comment
			while (!IsEndOfText())
			{
				uint32_t dashCount = 0;
				while (!IsEndOfText() && *m_current == '-')
				{
					dashCount++;
					AdvanceCurrent();
				}
				if (dashCount >= 3)
					return;
				else if (IsNewline(*m_current))
					ParseEndOfLine();
				else
					AdvanceCurrent();
			}
			Error("Mismatched block comments");
		}
		// This is a single line comment
		else
		{
			// Advance until the end of the line, then return
			while (!IsEndOfText())
			{
				if (IsNewline(*m_current))
				{
					ParseEndOfLine();
					return;
				}
				AdvanceCurrent();
			}
		}
	}